

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzhamtest.cpp
# Opt level: O2

int main_internal(string_array *cmd_line,int num_helper_threads,ilzham *lzham_dll)

{
  undefined8 *puVar1;
  const_iterator __position;
  pointer pcVar2;
  pointer pbVar3;
  double dVar4;
  comp_options options_00;
  comp_options options_01;
  comp_options options_02;
  size_t sVar5;
  bool bVar6;
  bool bVar7;
  lzham_compress_level lVar8;
  uint uVar9;
  lzham_compress_status_t lVar10;
  int iVar11;
  ulong uVar12;
  timer_ticks tVar13;
  timer_ticks tVar14;
  FILE *pFVar15;
  __off64_t _Var16;
  __off64_t _Var17;
  undefined1 recursive;
  _Alloc_hider _Var18;
  string_array *files;
  lzham_uint8 *plVar19;
  undefined8 uVar20;
  char *pMsg;
  char *pcVar21;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  comp_options options;
  lzham_uint32 decomp_adler32;
  uint local_954;
  char *local_950;
  string seed_filename;
  float local_91c;
  undefined1 local_918 [16];
  bool local_908;
  bool bStack_907;
  bool bStack_906;
  bool bStack_905;
  bool bStack_904;
  bool bStack_903;
  undefined2 uStack_902;
  undefined4 uStack_900;
  uint uStack_8fc;
  bool bStack_8f8;
  bool bStack_8f7;
  undefined1 uStack_8f6;
  undefined1 uStack_8f5;
  uint uStack_8f4;
  undefined8 local_8f0;
  undefined8 uStack_8e8;
  size_t cmp_len;
  pointer pbStack_8d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8c8;
  long local_8b8;
  long local_8b0;
  lzham_uint32 comp_adler32;
  uint uStack_8a4;
  lzham_compress_level lStack_8a0;
  lzham_uint32 lStack_89c;
  undefined2 local_898;
  size_t decomp_size;
  undefined5 uStack_880;
  undefined3 uStack_87b;
  undefined5 uStack_878;
  timer_ticks local_868;
  undefined1 local_860 [32];
  undefined8 uStack_840;
  lzham_uint8 cmp_buf [1024];
  lzham_uint8 decomp_buf [1024];
  
  options.m_comp_level = LZHAM_COMP_LEVEL_UBER;
  options.m_dict_size_log2 = 0x1c;
  options.m_compute_adler32_during_decomp = true;
  options.m_unbuffered_decompression = false;
  options.m_verify_compressed_data = false;
  options.m_randomize_params = false;
  options.m_extreme_parsing = false;
  options.m_deterministic_parsing = false;
  options.m_tradeoff_decomp_rate_for_comp_ratio = false;
  options.m_test_compressor_reinit = false;
  options.m_table_update_rate._0_3_ = 8;
  options.m_table_update_rate._3_1_ = 0;
  options.m_max_best_arrivals = 4;
  options.m_force_single_threaded_parsing = false;
  options.m_low_memory_finder = false;
  options.m_fast_bytes = 0;
  options.m_max_helper_threads = num_helper_threads;
  if ((cmd_line->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (cmd_line->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    print_usage();
    putchar(10);
    puts("LZHAM simple memory to memory compression test");
    bStack_904 = false;
    bStack_903 = false;
    uStack_902._0_1_ = false;
    uStack_902._1_1_ = 0;
    local_8f0._0_4_ = 0;
    local_8f0._4_4_ = 0;
    uStack_8e8._0_4_ = 0;
    uStack_8e8._4_4_ = 0;
    uStack_900 = 0;
    uStack_8fc = 0;
    bStack_8f8 = false;
    bStack_8f7 = false;
    uStack_8f6 = 0;
    uStack_8f5 = 0;
    uStack_8f4 = 0;
    local_918._0_4_ = 0x38;
    local_918._4_4_ = 0x1a;
    local_918._8_4_ = LZHAM_COMP_LEVEL_UBER;
    local_918._12_4_ = 0;
    local_908 = true;
    bStack_907 = false;
    bStack_906 = false;
    bStack_905 = false;
    cmp_len = 0x400;
    _comp_adler32 = (ulong)uStack_8a4 << 0x20;
    lVar10 = (*lzham_dll->lzham_compress_memory)
                       ((lzham_compress_params *)local_918,cmp_buf,&cmp_len,
                        (lzham_uint8 *)
                        "This is a test.This is a test.This is a test.1234567This is a test.This is a test.123456"
                        ,0x58,&comp_adler32);
    if (lVar10 == LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE) {
      printf("Uncompressed size: %u\nCompressed size: %u\n",0x58,cmp_len & 0xffffffff);
      local_860._24_8_ = (void *)0x0;
      uStack_840._0_4_ = 0;
      uStack_840._4_4_ = 0;
      local_860._8_8_ = 0;
      local_860._16_8_ = 0;
      local_860._0_4_ = 0x28;
      local_860._4_4_ = local_918._4_4_;
      if (options.m_compute_adler32_during_decomp == true) {
        local_860._8_8_ = 0x200000000;
      }
      decomp_size = 0x400;
      decomp_adler32 = 0;
      timer::timer((timer *)&seed_filename);
      timer::start((timer *)&seed_filename);
      lVar10 = (*lzham_dll->lzham_decompress_memory)
                         ((lzham_decompress_params *)local_860,decomp_buf,&decomp_size,cmp_buf,
                          cmp_len,&decomp_adler32);
      if (lVar10 == LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE) {
        if (((comp_adler32 == decomp_adler32) && (decomp_size == 0x58)) &&
           (iVar11 = bcmp(decomp_buf,
                          "This is a test.This is a test.This is a test.1234567This is a test.This is a test.123456"
                          ,0x58), iVar11 == 0)) {
          dVar4 = timer::get_elapsed_secs((timer *)&seed_filename);
          printf("Decompress time: %3.6f secs\n",SUB84(dVar4,0));
          puts("Compression test succeeded.");
          return 0;
        }
        print_error("Compression test failed!\n");
        return 1;
      }
    }
    print_error("Compression test failed with status %i!\n",(ulong)lVar10);
    return 1;
  }
  seed_filename._M_dataplus._M_p = (pointer)&seed_filename.field_2;
  seed_filename._M_string_length = 0;
  seed_filename.field_2._M_local_buf[0] = '\0';
  while (__position._M_current =
              (cmd_line->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start,
        0 < (int)((ulong)((long)(cmd_line->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                         (long)__position._M_current) >> 5)) {
    pcVar21 = ((__position._M_current)->_M_dataplus)._M_p;
    if (*pcVar21 != 0x2d) {
      if ((options.m_unbuffered_decompression == true) && (seed_filename._M_string_length != 0)) {
        pcVar21 = "Unbuffered decompression is not compatible with seed files!\n";
      }
      else {
        if ((__position._M_current)->_M_string_length != 1) {
LAB_00104af5:
          pMsg = "Invalid mode: %s\n";
          goto LAB_00104afc;
        }
        iVar11 = tolower((int)*pcVar21);
        if (iVar11 == 0x61) {
          iVar11 = 2;
        }
        else if (iVar11 == 99) {
          iVar11 = 0;
        }
        else {
          if (iVar11 != 100) goto LAB_00104af5;
          iVar11 = 1;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::erase(cmd_line,__position);
        puts("Using options:");
        comp_options::print(&options);
        putchar(10);
        bVar6 = options.m_randomize_params;
        pbVar3 = (cmd_line->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar12 = (long)(cmd_line->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3;
        if (iVar11 == 2) {
          if ((long)uVar12 >> 5 == 1) {
            pcVar21 = (pbVar3->_M_dataplus)._M_p;
            local_898 = CONCAT11(options.m_verify_compressed_data,options.m_unbuffered_decompression
                                );
            lStack_89c = options.m_max_helper_threads;
            lStack_8a0 = options._8_4_;
            comp_adler32 = options.m_comp_level;
            uStack_8a4 = options.m_dict_size_log2;
            recursive = SUB81(&options.m_extreme_parsing,0);
            uStack_878 = CONCAT41(options.m_fast_bytes,options._35_1_);
            decomp_size = CONCAT44(options._23_4_,
                                   CONCAT13(options.m_test_compressor_reinit,
                                            CONCAT12(options.m_tradeoff_decomp_rate_for_comp_ratio,
                                                     CONCAT11(options.m_deterministic_parsing,
                                                              options.m_extreme_parsing))));
            uStack_880 = CONCAT41(options.m_max_best_arrivals,options.m_table_update_rate._3_1_);
            uStack_87b = (undefined3)
                         (CONCAT17(options._34_1_,
                                   CONCAT16(options.m_low_memory_finder,
                                            CONCAT15(options.m_force_single_threaded_parsing,
                                                     uStack_880))) >> 0x28);
            local_950 = (char *)seed_filename._M_string_length;
            if (seed_filename._M_string_length != 0) {
              local_950 = seed_filename._M_dataplus._M_p;
            }
            cmp_len = 0;
            pbStack_8d0 = (pointer)0x0;
            local_8c8._M_allocated_capacity = 0;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_860,pcVar21,(allocator<char> *)decomp_buf);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)cmp_buf,"*",(allocator<char> *)local_918);
            bVar7 = find_files((string *)local_860,(string *)&cmp_len,files,(bool)recursive);
            std::__cxx11::string::~string((string *)cmp_buf);
            std::__cxx11::string::~string((string *)local_860);
            if (!bVar7) {
              print_error("Failed finding files under path \"%s\"!\n",pcVar21);
              uVar9 = 1;
              goto LAB_001052e8;
            }
            tVar13 = timer::get_ticks();
            tVar14 = timer::get_init_ticks();
            local_868 = tVar13;
            sprintf((char *)cmp_buf,"__comp_temp_%u__.tmp",tVar14 & 0xffffffff);
            sprintf((char *)decomp_buf,"__decomp_temp_%u__.tmp",tVar14 & 0xffffffff);
            local_8b0 = 0;
            local_8b8 = 0;
            local_954 = 0;
            uVar9 = 0;
            goto LAB_00104eb4;
          }
          if ((long)uVar12 >> 5 != 0) goto LAB_00104d61;
          pcVar21 = "No directory specified!\n";
        }
        else {
          if (iVar11 == 1) {
            if (uVar12 < 0x21) {
LAB_00104c1c:
              pcVar21 = "Must specify input and output filenames!\n";
              goto LAB_00104ac4;
            }
            if (uVar12 == 0x40) {
              _Var18._M_p = (pointer)seed_filename._M_string_length;
              if (seed_filename._M_string_length != 0) {
                _Var18 = seed_filename._M_dataplus;
              }
              options_00.m_low_memory_finder = options.m_low_memory_finder;
              options_00.m_force_single_threaded_parsing = options.m_force_single_threaded_parsing;
              options_00._34_1_ = options._34_1_;
              options_00._35_1_ = options._35_1_;
              options_00.m_fast_bytes = options.m_fast_bytes;
              options_00.m_max_helper_threads = options.m_max_helper_threads;
              options_00.m_compute_adler32_during_decomp = options.m_compute_adler32_during_decomp;
              options_00._9_3_ = options._9_3_;
              options_00.m_verify_compressed_data = options.m_verify_compressed_data;
              options_00.m_unbuffered_decompression = options.m_unbuffered_decompression;
              options_00.m_randomize_params = options.m_randomize_params;
              options_00.m_extreme_parsing = options.m_extreme_parsing;
              options_00.m_deterministic_parsing = options.m_deterministic_parsing;
              options_00.m_tradeoff_decomp_rate_for_comp_ratio =
                   options.m_tradeoff_decomp_rate_for_comp_ratio;
              options_00.m_test_compressor_reinit = options.m_test_compressor_reinit;
              options_00._23_1_ = options._23_1_;
              options_00.m_table_update_rate._3_1_ = options.m_table_update_rate._3_1_;
              options_00.m_table_update_rate._0_3_ = (undefined3)options.m_table_update_rate;
              options_00.m_max_best_arrivals = options.m_max_best_arrivals;
              options_00.m_comp_level = options.m_comp_level;
              options_00.m_dict_size_log2 = options.m_dict_size_log2;
              bVar6 = decompress_file(lzham_dll,(pbVar3->_M_dataplus)._M_p,
                                      pbVar3[1]._M_dataplus._M_p,options_00,_Var18._M_p,(float *)0x0
                                     );
              uVar9 = (uint)!bVar6;
              goto LAB_00104b09;
            }
          }
          else {
            if (uVar12 < 0x21) goto LAB_00104c1c;
            if (uVar12 == 0x40) {
              _Var18._M_p = (pointer)seed_filename._M_string_length;
              if (seed_filename._M_string_length != 0) {
                _Var18 = seed_filename._M_dataplus;
              }
              bVar6 = compress_file(lzham_dll,(pbVar3->_M_dataplus)._M_p,pbVar3[1]._M_dataplus._M_p,
                                    &options,_Var18._M_p,(float *)0x0);
              if (!bVar6) goto LAB_00104b06;
              uVar9 = 0;
              if (options.m_verify_compressed_data != true) goto LAB_00104b09;
              dVar4 = timer::get_ms();
              sprintf((char *)cmp_buf,"__decomp_temp_%u__.tmp",(long)dVar4);
              _Var18._M_p = (pointer)seed_filename._M_string_length;
              if (seed_filename._M_string_length != 0) {
                _Var18 = seed_filename._M_dataplus;
              }
              options_01.m_low_memory_finder = options.m_low_memory_finder;
              options_01.m_force_single_threaded_parsing = options.m_force_single_threaded_parsing;
              options_01._34_1_ = options._34_1_;
              options_01._35_1_ = options._35_1_;
              options_01.m_fast_bytes = options.m_fast_bytes;
              options_01.m_max_helper_threads = options.m_max_helper_threads;
              options_01.m_compute_adler32_during_decomp = options.m_compute_adler32_during_decomp;
              options_01._9_3_ = options._9_3_;
              options_01.m_verify_compressed_data = options.m_verify_compressed_data;
              options_01.m_unbuffered_decompression = options.m_unbuffered_decompression;
              options_01.m_randomize_params = options.m_randomize_params;
              options_01.m_extreme_parsing = options.m_extreme_parsing;
              options_01.m_deterministic_parsing = options.m_deterministic_parsing;
              options_01.m_tradeoff_decomp_rate_for_comp_ratio =
                   options.m_tradeoff_decomp_rate_for_comp_ratio;
              options_01.m_test_compressor_reinit = options.m_test_compressor_reinit;
              options_01._23_1_ = options._23_1_;
              options_01.m_table_update_rate._3_1_ = options.m_table_update_rate._3_1_;
              options_01.m_table_update_rate._0_3_ = (undefined3)options.m_table_update_rate;
              options_01.m_max_best_arrivals = options.m_max_best_arrivals;
              options_01.m_comp_level = options.m_comp_level;
              options_01.m_dict_size_log2 = options.m_dict_size_log2;
              bVar6 = decompress_file(lzham_dll,pbVar3[1]._M_dataplus._M_p,(char *)cmp_buf,
                                      options_01,_Var18._M_p,(float *)0x0);
              if (bVar6) {
                printf("Comparing file \"%s\" to \"%s\"\n",cmp_buf,(pbVar3->_M_dataplus)._M_p);
                bVar6 = compare_files((char *)cmp_buf,(pbVar3->_M_dataplus)._M_p);
                if (!bVar6) {
                  print_error("Failed comparing decompressed file data while compressing \"%s\" to \"%s\"\n"
                              ,(pbVar3->_M_dataplus)._M_p,pbVar3[1]._M_dataplus._M_p);
                  goto LAB_00104b06;
                }
                puts("Decompressed file compared OK to original file.");
                remove((char *)cmp_buf);
                uVar9 = 0;
                goto LAB_00104b09;
              }
              _Var18._M_p = (pointer)seed_filename._M_string_length;
              if (seed_filename._M_string_length != 0) {
                _Var18 = seed_filename._M_dataplus;
              }
              print_error("Failed decompressing file \"%s\" to \"%s\"\n",pbVar3[1]._M_dataplus._M_p,
                          cmp_buf,_Var18._M_p);
              goto LAB_00104b06;
            }
          }
LAB_00104d61:
          pcVar21 = "Too many filenames!\n";
        }
      }
LAB_00104ac4:
      print_error(pcVar21);
      goto LAB_00104b06;
    }
    if ((__position._M_current)->_M_string_length < 2) {
switchD_00104795_caseD_67:
      pMsg = "Invalid option: %s\n";
LAB_00104afc:
      print_error(pMsg,pcVar21);
      goto LAB_00104b06;
    }
    uVar9 = options.m_max_helper_threads;
    switch(pcVar21[1]) {
    case 'a':
      std::__cxx11::string::assign((char *)&seed_filename);
      if (seed_filename._M_string_length == 0) {
        pcVar21 = "Must specify seed filename with -a option!\n";
        goto LAB_00104ac4;
      }
      printf("Seed filename: %s\n",seed_filename._M_dataplus._M_p);
      uVar9 = options.m_max_helper_threads;
      break;
    case 'b':
      options.m_force_single_threaded_parsing = true;
      break;
    case 'c':
      options._8_4_ = options._8_4_ & 0xffffff00;
      break;
    case 'd':
      iVar11 = atoi(pcVar21 + 2);
      if (iVar11 - 0xfU < 0xf) {
        options.m_dict_size_log2 = iVar11;
        uVar9 = options.m_max_helper_threads;
        break;
      }
      pMsg = "Invalid dictionary size: %s\n";
      goto LAB_00104afc;
    case 'e':
      options.m_deterministic_parsing = true;
      break;
    case 'f':
      options.m_fast_bytes = atoi(pcVar21 + 2);
      uVar9 = options.m_max_helper_threads;
      break;
    case 'g':
    case 'j':
    case 'k':
    case 'l':
    case 'n':
    case 'p':
    case 'q':
    case 'w':
      goto switchD_00104795_caseD_67;
    case 'h':
      uVar9 = atoi(pcVar21 + 2);
      if (0x14 < uVar9) {
        pMsg = "Invalid table update rate: %s\n";
        goto LAB_00104afc;
      }
      options.m_table_update_rate._0_3_ = (undefined3)uVar9;
      options.m_table_update_rate._3_1_ = (undefined1)(uVar9 >> 0x18);
      uVar9 = options.m_max_helper_threads;
      break;
    case 'i':
      options.m_test_compressor_reinit = true;
      options.m_deterministic_parsing = true;
      break;
    case 'm':
      lVar8 = atoi(pcVar21 + 2);
      if (LZHAM_COMP_LEVEL_UBER < lVar8) {
        pMsg = "Invalid compression level: %s\n";
        goto LAB_00104afc;
      }
      options.m_comp_level = lVar8;
      uVar9 = options.m_max_helper_threads;
      break;
    case 'o':
      options.m_tradeoff_decomp_rate_for_comp_ratio = true;
      break;
    case 'r':
      options.m_randomize_params = true;
      break;
    case 's':
      uVar9 = atoi(pcVar21 + 2);
      srand(uVar9);
      printf("Using random seed: %i\n",(ulong)uVar9);
      uVar9 = options.m_max_helper_threads;
      break;
    case 't':
      uVar9 = atoi(pcVar21 + 2);
      if (0x40 < uVar9) {
        pMsg = "Invalid number of helper threads: %s\n";
        goto LAB_00104afc;
      }
      break;
    case 'u':
      options.m_unbuffered_decompression = true;
      break;
    case 'v':
      options.m_verify_compressed_data = true;
      break;
    case 'x':
      options.m_extreme_parsing = true;
      pcVar2 = ((__position._M_current)->_M_dataplus)._M_p;
      if (pcVar2[2] != '\0') {
        options.m_max_best_arrivals = atoi(pcVar2 + 2);
        uVar9 = options.m_max_helper_threads;
      }
      break;
    default:
      if (pcVar21[1] != 'F') goto switchD_00104795_caseD_67;
      options.m_low_memory_finder = true;
    }
    options.m_max_helper_threads = uVar9;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase(cmd_line,(cmd_line->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start);
  }
  print_error("No mode specified!\n");
  print_usage();
LAB_00104b06:
  uVar9 = 1;
  goto LAB_00104b09;
LAB_00104eb4:
  sVar5 = cmp_len;
  uVar24 = (ulong)uVar9;
  uVar12 = (long)((long)pbStack_8d0 - cmp_len) >> 5;
  if (uVar24 < uVar12) {
    lVar23 = uVar24 * 0x20;
    puVar1 = (undefined8 *)(cmp_len + lVar23);
    uVar22 = uVar9 + 1;
    printf("***** [%u of %u] Compressing file \"%s\" to \"%s\"\n",(ulong)uVar22,uVar12 & 0xffffffff,
           *(undefined8 *)(cmp_len + lVar23),cmp_buf);
    pFVar15 = fopen64(*(char **)(sVar5 + lVar23),"rb");
    if (pFVar15 == (FILE *)0x0) {
      printf("Skipping unreadable file \"%s\"\n",*puVar1);
      uVar9 = uVar22;
    }
    else {
      fseek(pFVar15,0,2);
      _Var16 = ftello64(pFVar15);
      if (_Var16 == 0) {
LAB_00104f8a:
        fclose(pFVar15);
        bVar7 = ensure_file_is_writable((char *)cmp_buf);
        if (!bVar7) {
          plVar19 = cmp_buf;
LAB_0010536f:
          print_error("Unable to create file \"%s\"!\n",plVar19);
          goto LAB_001052df;
        }
        local_908 = SUB21(local_898,0);
        bStack_907 = SUB21((ushort)local_898 >> 8,0);
        local_918._0_4_ = comp_adler32;
        local_918._4_4_ = uStack_8a4;
        local_918._8_4_ = lStack_8a0;
        local_918._12_4_ = lStack_89c;
        bStack_906 = bVar6;
        uStack_8f5 = (undefined1)uStack_878;
        uStack_8f4 = (uint)((uint5)uStack_878 >> 8);
        bStack_905 = SUB81(decomp_size,0);
        bStack_904 = SUB81(decomp_size >> 8,0);
        bStack_903 = SUB81(decomp_size >> 0x10,0);
        uStack_902 = (undefined2)(decomp_size >> 0x18);
        uStack_900._0_3_ = (undefined3)(decomp_size >> 0x28);
        uStack_900._3_1_ = (undefined1)uStack_880;
        uStack_8fc = (uint)((uint5)uStack_880 >> 8);
        bStack_8f8 = SUB31(uStack_87b,0);
        bStack_8f7 = SUB31((uint3)uStack_87b >> 8,0);
        uStack_8f6 = (undefined1)((uint3)uStack_87b >> 0x10);
        if ((bVar6 & 1U) != 0) {
          bVar7 = local_950 == (char *)0x0;
          uVar22 = rand();
          local_918._0_4_ = uVar22 % 5;
          iVar11 = rand();
          local_918._4_4_ = iVar11 % 0xf + 0xf;
          iVar11 = rand();
          local_918._12_4_ = iVar11 % 0x41;
          iVar11 = rand();
          local_908 = (bool)((byte)iVar11 & bVar7);
          iVar11 = rand();
          bStack_904 = (bool)((byte)iVar11 & 1);
          iVar11 = rand();
          bStack_903 = (bool)((byte)iVar11 & 1);
          iVar11 = rand();
          uStack_900 = iVar11 % 0x13 + 2;
          iVar11 = rand();
          uStack_8fc = iVar11 % 7 + 2;
          iVar11 = rand();
          bStack_8f8 = (bool)((byte)iVar11 & 1);
          iVar11 = rand();
          bStack_8f7 = (bool)((byte)iVar11 & 1);
          iVar11 = rand();
          uStack_8f4 = iVar11 % 0xfb + 8;
          comp_options::print((comp_options *)local_918);
        }
        decomp_adler32 = 0;
        local_91c = 0.0;
        bVar7 = compress_file(lzham_dll,(char *)*puVar1,(char *)cmp_buf,(comp_options *)local_918,
                              local_950,(float *)&decomp_adler32);
        if (!bVar7) {
          uVar20 = *puVar1;
          pcVar21 = "Failed compressing file \"%s\" to \"%s\"\n";
LAB_0010539d:
          plVar19 = cmp_buf;
LAB_001053a5:
          print_error(pcVar21,uVar20,plVar19);
          goto LAB_001052df;
        }
        if (bStack_907 == true) {
          printf("Decompressing file \"%s\" to \"%s\"\n",cmp_buf,decomp_buf);
          bVar7 = ensure_file_is_writable((char *)decomp_buf);
          if (!bVar7) {
            plVar19 = decomp_buf;
            goto LAB_0010536f;
          }
          options_02.m_low_memory_finder = bStack_8f7;
          options_02.m_force_single_threaded_parsing = bStack_8f8;
          options_02._34_1_ = uStack_8f6;
          options_02._35_1_ = uStack_8f5;
          options_02.m_fast_bytes = uStack_8f4;
          options_02.m_verify_compressed_data = bStack_907;
          options_02.m_unbuffered_decompression = local_908;
          options_02.m_randomize_params = bStack_906;
          options_02.m_extreme_parsing = bStack_905;
          options_02.m_deterministic_parsing = bStack_904;
          options_02.m_tradeoff_decomp_rate_for_comp_ratio = bStack_903;
          options_02.m_test_compressor_reinit = uStack_902._0_1_;
          options_02._23_1_ = uStack_902._1_1_;
          options_02.m_max_best_arrivals = uStack_8fc;
          options_02.m_table_update_rate = uStack_900;
          options_02.m_compute_adler32_during_decomp = (bool)local_918[8];
          options_02._9_3_ = local_918._9_3_;
          options_02.m_max_helper_threads = local_918._12_4_;
          options_02.m_comp_level = local_918._0_4_;
          options_02.m_dict_size_log2 = local_918._4_4_;
          bVar7 = decompress_file(lzham_dll,(char *)cmp_buf,(char *)decomp_buf,options_02,local_950,
                                  &local_91c);
          uVar20 = *puVar1;
          if (!bVar7) {
            pcVar21 = "Failed decompressing file \"%s\" to \"%s\"\n";
            plVar19 = decomp_buf;
            goto LAB_001053a5;
          }
          printf("Comparing file \"%s\" to \"%s\"\n",decomp_buf);
          bVar7 = compare_files((char *)decomp_buf,(char *)*puVar1);
          if (!bVar7) {
            uVar20 = *puVar1;
            pcVar21 = "Failed comparing decompressed file data while compressing \"%s\" to \"%s\"\n"
            ;
            goto LAB_0010539d;
          }
          puts("Decompressed file compared OK to original file.");
        }
        pFVar15 = fopen64((char *)cmp_buf,"rb");
        if (pFVar15 == (FILE *)0x0) {
          _Var17 = 0;
        }
        else {
          fseek(pFVar15,0,2);
          _Var17 = ftello64(pFVar15);
          fclose(pFVar15);
        }
        local_8b0 = local_8b0 + _Var17;
        local_8b8 = local_8b8 + _Var16;
        local_954 = local_954 + 1;
        putchar(10);
        uVar9 = uVar9 + 1;
      }
      else {
        fseek(pFVar15,0,0);
        iVar11 = fgetc(pFVar15);
        if (iVar11 != -1) goto LAB_00104f8a;
        printf("Skipping unreadable file \"%s\"\n",*puVar1);
        fclose(pFVar15);
        uVar9 = uVar22;
      }
    }
    goto LAB_00104eb4;
  }
  tVar13 = timer::get_ticks();
  dVar4 = timer::ticks_to_secs(tVar13 - local_868);
  printf("Test successful: %f secs\n",SUB84(dVar4,0));
  printf("Total files processed: %u\n",(ulong)local_954);
  printf("Total source size: %llu\n",local_8b8);
  printf("Total compressed size: %llu\n",local_8b0);
  remove((char *)cmp_buf);
  remove((char *)decomp_buf);
LAB_001052df:
  uVar9 = (uint)(uVar24 < uVar12);
LAB_001052e8:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&cmp_len);
LAB_00104b09:
  std::__cxx11::string::~string((string *)&seed_filename);
  return uVar9;
}

Assistant:

int main_internal(string_array cmd_line, int num_helper_threads, ilzham &lzham_dll)
{
   comp_options options;
   options.m_max_helper_threads = num_helper_threads;

#ifdef _XBOX
   options.m_dict_size_log2 = 21;
#endif

   if (!cmd_line.size())
   {
      print_usage();
      return simple_test(lzham_dll, options);
   }

   enum op_mode_t
   {
      OP_MODE_INVALID = -1,
      OP_MODE_COMPRESS = 0,
      OP_MODE_DECOMPRESS = 1,
      OP_MODE_ALL = 2
   };

   op_mode_t op_mode = OP_MODE_INVALID;
   std::string seed_filename;

   for (int i = 0; i < (int)cmd_line.size(); i++)
   {
      const std::string &str = cmd_line[i];
      if (str[0] == '-')
      {
         if (str.size() < 2)
         {
            print_error("Invalid option: %s\n", str.c_str());
            return EXIT_FAILURE;
         }
         switch (str[1])
         {
            case 'u':
            {
               options.m_unbuffered_decompression = true;
               break;
            }
            case 'd':
            {
               int dict_size = atoi(str.c_str() + 2);
               if ((dict_size < LZHAM_MIN_DICT_SIZE_LOG2) || (dict_size > LZHAMTEST_MAX_POSSIBLE_DICT_SIZE))
               {
                  print_error("Invalid dictionary size: %s\n", str.c_str());
                  return EXIT_FAILURE;
               }
               options.m_dict_size_log2 = dict_size;
               break;
            }
            case 'm':
            {
               int comp_level = atoi(str.c_str() + 2);
               if ((comp_level < 0) || (comp_level > (int)LZHAM_COMP_LEVEL_UBER))
               {
                  print_error("Invalid compression level: %s\n", str.c_str());
                  return EXIT_FAILURE;
               }
               options.m_comp_level = static_cast<lzham_compress_level>(comp_level);
               break;
            }
            case 't':
            {
               int num_threads = atoi(str.c_str() + 2);
               if ((num_threads < 0) || (num_threads > LZHAM_MAX_HELPER_THREADS))
               {
                  print_error("Invalid number of helper threads: %s\n", str.c_str());
                  return EXIT_FAILURE;
               }
               options.m_max_helper_threads = num_threads;
               break;
            }
				case 'h':
				{
					int update_rate = atoi(str.c_str() + 2);
					if ((update_rate < 0) || (update_rate > LZHAM_FASTEST_TABLE_UPDATE_RATE))
					{
						print_error("Invalid table update rate: %s\n", str.c_str());
						return EXIT_FAILURE;
					}
					options.m_table_update_rate = update_rate;
					break;
				}
            case 'c':
            {
               options.m_compute_adler32_during_decomp = false;
               break;
            }
            case 'v':
            {
               options.m_verify_compressed_data = true;
               break;
            }
            case 'r':
            {
               options.m_randomize_params = true;
               break;
            }
            case 'x':
            {
               options.m_extreme_parsing = true;

               if (str[2])
               {
                  options.m_max_best_arrivals = atoi(str.c_str() + 2);
               }

               break;
            }
            case 'e':
            {
               options.m_deterministic_parsing = true;
               break;
            }
            case 'o':
            {
               options.m_tradeoff_decomp_rate_for_comp_ratio = true;
               break;
            }
            case 'i':
            {
               options.m_test_compressor_reinit = true;
               options.m_deterministic_parsing = true;
               break;
            }
            case 's':
            {
               int seed = atoi(str.c_str() + 2);
               srand(seed);
               printf("Using random seed: %i\n", seed);
               break;
            }
            case 'a':
            {
               seed_filename = str.c_str() + 2;
               if (seed_filename.empty())
               {
                  print_error("Must specify seed filename with -a option!\n");
                  return EXIT_FAILURE;
               }
               printf("Seed filename: %s\n", seed_filename.c_str());
               break;
            }
            case 'b':
            {
               options.m_force_single_threaded_parsing = true;
               break;
            }
            case 'F':
            {
               options.m_low_memory_finder = true;
               break;
            }
            case 'f':
            {
               options.m_fast_bytes = atoi(str.c_str() + 2);
               break;
            }
            default:
            {
               print_error("Invalid option: %s\n", str.c_str());
               return EXIT_FAILURE;
            }
         }

         cmd_line.erase(cmd_line.begin() + i);
         i--;

         continue;
      }

      if ((options.m_unbuffered_decompression) && (!seed_filename.empty()))
      {
         print_error("Unbuffered decompression is not compatible with seed files!\n");
         return EXIT_FAILURE;
      }

      if (str.size() != 1)
      {
         print_error("Invalid mode: %s\n", str.c_str());
         return EXIT_FAILURE;
      }
      switch (tolower(str[0]))
      {
         case 'c':
         {
            op_mode = OP_MODE_COMPRESS;
            break;
         }
         case 'd':
         {
            op_mode = OP_MODE_DECOMPRESS;
            break;
         }
         case 'a':
         {
            op_mode = OP_MODE_ALL;
            break;
         }
         default:
         {
            print_error("Invalid mode: %s\n", str.c_str());
            return EXIT_FAILURE;
         }
      }
      cmd_line.erase(cmd_line.begin() + i);
      break;
   }

   if (op_mode == OP_MODE_INVALID)
   {
      print_error("No mode specified!\n");
      print_usage();
      return EXIT_FAILURE;
   }

   printf("Using options:\n");
   options.print();
   printf("\n");

   int exit_status = EXIT_FAILURE;

   switch (op_mode)
   {
      case OP_MODE_COMPRESS:
      {
         if (cmd_line.size() < 2)
         {
            print_error("Must specify input and output filenames!\n");
            return EXIT_FAILURE;
         }
         else if (cmd_line.size() > 2)
         {
            print_error("Too many filenames!\n");
            return EXIT_FAILURE;
         }

         const std::string &src_file = cmd_line[0];
         const std::string &cmp_file = cmd_line[1];

         bool comp_result = compress_file(lzham_dll, src_file.c_str(), cmp_file.c_str(), options, seed_filename.length() ? seed_filename.c_str() : NULL);
         if (comp_result)
            exit_status = EXIT_SUCCESS;

         if ((comp_result) && (options.m_verify_compressed_data))
         {
            char decomp_file[256];

#ifdef _XBOX
            sprintf(decomp_file, "e:\\__decomp_temp_%u__.tmp", (uint)GetTickCount());
#else
            sprintf(decomp_file, "__decomp_temp_%u__.tmp", (uint)timer::get_ms());
#endif
            if (!decompress_file(lzham_dll, cmp_file.c_str(), decomp_file, options, seed_filename.length() ? seed_filename.c_str() : NULL))
            {
               print_error("Failed decompressing file \"%s\" to \"%s\"\n", cmp_file.c_str(), decomp_file, seed_filename.length() ? seed_filename.c_str() : NULL);
               return EXIT_FAILURE;
            }

            printf("Comparing file \"%s\" to \"%s\"\n", decomp_file, src_file.c_str());

            if (!compare_files(decomp_file, src_file.c_str()))
            {
               print_error("Failed comparing decompressed file data while compressing \"%s\" to \"%s\"\n", src_file.c_str(), cmp_file.c_str());
               return EXIT_FAILURE;
            }
            else
            {
               printf("Decompressed file compared OK to original file.\n");
            }

            remove(decomp_file);
         }

         break;
      }
      case OP_MODE_DECOMPRESS:
      {
         if (cmd_line.size() < 2)
         {
            print_error("Must specify input and output filenames!\n");
            return EXIT_FAILURE;
         }
         else if (cmd_line.size() > 2)
         {
            print_error("Too many filenames!\n");
            return EXIT_FAILURE;
         }

         for (uint i = 0; i < 1; i++)
         {
            if (decompress_file(lzham_dll, cmd_line[0].c_str(), cmd_line[1].c_str(), options, seed_filename.length() ? seed_filename.c_str() : NULL))
               exit_status = EXIT_SUCCESS;
            else
               break;
         }
         break;
      }
      case OP_MODE_ALL:
      {
         if (!cmd_line.size())
         {
            print_error("No directory specified!\n");
            return EXIT_FAILURE;
         }
         else if (cmd_line.size() != 1)
         {
            print_error("Too many filenames!\n");
            return EXIT_FAILURE;
         }

#if 0
			file_stats_vec stats;

         if (test_recursive(lzham_dll, cmd_line[0].c_str(), options, seed_filename.length() ? seed_filename.c_str() : NULL, &stats, 1, 1024*1024*512))
				exit_status = EXIT_SUCCESS;

			FILE *pFile = fopen("stats.csv", "w");
			if (pFile)
			{
				const float cpu_slowdown = 12.0f;
				float low_bps = 10000.0f;
				float scale_bps = 3125000.0f / 5.0f;
				//const float low_bps = 10000.0f / 10.0f;
				//const float scale_bps = 3125000.0f / 10.0f;

				for (uint i = 0; i < stats.size(); i++)
				{
					fprintf(pFile, "%s, %" PRIi64 ", , %" PRIi64 ", %f, %f, %f, , %" PRIi64 ", %f, %f, %f",
						stats[i].m_filename.c_str(),
						stats[i].m_size,
						stats[i].m_lzma_size, ((1.0f - (static_cast<float>(stats[i].m_lzma_size) / stats[i].m_size)) * 100.0f), stats[i].m_lzma_comp_time, stats[i].m_lzma_decomp_time,
						stats[i].m_lzham_size, ((1.0f - (static_cast<float>(stats[i].m_lzham_size) / stats[i].m_size)) * 100.0f), stats[i].m_lzham_comp_time, stats[i].m_lzham_decomp_time);

#if 0
					fprintf(pFile, ",");
					for (uint j = 0; j < 64; j++)
					{
						float bps = (low_bps + (j * scale_bps)) / 8.0f;
						float download_time = stats[i].m_lzma_size / bps;
						float decomp_time = stats[i].m_lzma_decomp_time * cpu_slowdown;

						float total_time = bf::math::maximum<float>(download_time, decomp_time);
						//float total_time = download_time + decomp_time;
						fprintf(pFile, ", %3.2f", stats[i].m_size / total_time / (1024.0f*1024.0f));
					}

					fprintf(pFile, ",");

					for (uint j = 0; j < 64; j++)
					{
						float bps = (low_bps + (j * scale_bps)) / 8.0f;
						float download_time = stats[i].m_lzham_size / bps;
						float decomp_time = stats[i].m_lzham_decomp_time * cpu_slowdown;

						float total_time = bf::math::maximum<float>(download_time, decomp_time);
						//float total_time = download_time + decomp_time;
						fprintf(pFile, ", %3.2f", stats[i].m_size / total_time / (1024.0f*1024.0f));
					}

					fprintf(pFile, ",");

					for (uint j = 0; j < 64; j++)
					{
						float bps = (low_bps + (j * scale_bps)) / 8.0f;
						float download_time = stats[i].m_miniz_size / bps;
						float decomp_time = stats[i].m_miniz_decomp_time * cpu_slowdown;

						float total_time = bf::math::maximum<float>(download_time, decomp_time);
						//float total_time = download_time + decomp_time;
						fprintf(pFile, ", %3.2f", (stats[i].m_size / total_time) / (1024.0f*1024.0f));
					}

					fprintf(pFile, ",");

					for (uint j = 0; j < 64; j++)
					{
						float bps = (low_bps + (j * scale_bps)) / 8.0f;
						float download_time = stats[i].m_size / bps;
						float decomp_time = 0.0f;

						float total_time = bf::math::maximum<float>(download_time, decomp_time);
						//float total_time = download_time + decomp_time;
						fprintf(pFile, ", %3.2f", (stats[i].m_size / total_time) / (1024.0f*1024.0f));
					}

					fprintf(pFile, ",");

					for (uint j = 0; j < 64; j++)
					{
						float bps = (low_bps + (j * scale_bps)) / 8.0f;
						float download_time = stats[i].m_lz4_size / bps;
						float decomp_time = stats[i].m_lz4_decomp_time * cpu_slowdown;

						float total_time = bf::math::maximum<float>(download_time, decomp_time);
						//float total_time = download_time + decomp_time;
						fprintf(pFile, ", %3.2f", (stats[i].m_size / total_time) / (1024.0f*1024.0f));
					}
#endif

					fprintf(pFile, "\n");
				}

#if 0
				for (uint j = 0; j < 64; j++)
				{
					fprintf(pFile, "%3.2f, ",  (low_bps + (j * scale_bps)) / 8.0f / (1024.0f * 1024.0f));
				}
#endif

				fclose(pFile);
			}
#else
			if (test_recursive(lzham_dll, cmd_line[0].c_str(), options, seed_filename.length() ? seed_filename.c_str() : NULL))
				exit_status = EXIT_SUCCESS;
#endif

         break;
      }
      default:
      {
         print_error("No mode specified!\n");
         print_usage();
         return EXIT_FAILURE;
      }
   }

   return exit_status;
}